

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageChar(gdImagePtr im,gdFontPtr f,int x,int y,int c,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int x_00;
  int iVar6;
  int y_00;
  
  iVar1 = f->offset;
  if (((iVar1 <= c) && (c < iVar1 + f->nchars)) && (iVar2 = f->h, 0 < iVar2)) {
    iVar3 = f->w;
    iVar5 = 0;
    y_00 = y;
    do {
      iVar4 = f->w;
      iVar6 = iVar2 * (c - iVar1) * iVar3;
      x_00 = x;
      if (0 < iVar4) {
        do {
          if (f->data[iVar4 * iVar5 + iVar6] != '\0') {
            gdImageSetPixel(im,x_00,y_00,color);
          }
          x_00 = x_00 + 1;
          iVar4 = f->w;
          iVar6 = iVar6 + 1;
        } while (x_00 < iVar4 + x);
      }
      iVar5 = iVar5 + 1;
      y_00 = y_00 + 1;
    } while (y_00 < f->h + y);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageChar (gdImagePtr im, gdFontPtr f, int x, int y, int c, int color)
{
	int cx, cy;
	int px, py;
	int fline;
	cx = 0;
	cy = 0;
#ifdef CHARSET_EBCDIC
	c = ASC (c);
#endif /*CHARSET_EBCDIC */
	if ((c < f->offset) || (c >= (f->offset + f->nchars))) {
		return;
	}
	fline = (c - f->offset) * f->h * f->w;
	for (py = y; (py < (y + f->h)); py++) {
		for (px = x; (px < (x + f->w)); px++) {
			if (f->data[fline + cy * f->w + cx]) {
				gdImageSetPixel (im, px, py, color);
			}
			cx++;
		}
		cx = 0;
		cy++;
	}
}